

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

bool __thiscall QFSFileEnginePrivate::closeFdFh(QFSFileEnginePrivate *this)

{
  QAbstractFileEngine *this_00;
  byte bVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fd != -1 || this->fh != (FILE *)0x0) {
    this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
    if (this->fh == (FILE *)0x0) {
      bVar4 = 0;
    }
    else {
      bVar4 = 1;
      if (this->lastFlushFailed == false) {
        iVar2 = (*this_00->_vptr_QAbstractFileEngine[4])(this_00);
        bVar4 = (byte)iVar2 ^ 1;
      }
    }
    this->field_0xc2 = this->field_0xc2 & 0xfb;
    if (this->closeFileHandle == true) {
      if ((FILE *)this->fh == (FILE *)0x0) {
        iVar2 = qt_safe_close(this->fd);
      }
      else {
        iVar2 = fclose((FILE *)this->fh);
      }
      this->fh = (FILE *)0x0;
      this->fd = -1;
      bVar5 = iVar2 != 0;
    }
    else {
      bVar5 = false;
    }
    bVar1 = (bVar5 | bVar4) ^ 1;
    if (bVar4 != 0 || bVar1 != 0) goto LAB_001168fb;
    piVar3 = __errno_location();
    QSystemError::stdString((QString *)&QStack_38,*piVar3);
    QAbstractFileEngine::setError(this_00,UnspecifiedError,(QString *)&QStack_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  }
  bVar1 = 0;
LAB_001168fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEnginePrivate::closeFdFh()
{
    Q_Q(QFSFileEngine);
    if (fd == -1 && !fh)
        return false;

    // Flush the file if it's buffered, and if the last flush didn't fail.
    bool flushed = !fh || (!lastFlushFailed && q->flush());
    bool closed = true;
    tried_stat = 0;

    // Close the file if we created the handle.
    if (closeFileHandle) {
        int ret;

        if (fh) {
            // Close buffered file.
            ret = fclose(fh);
        } else {
            // Close unbuffered file.
            ret = QT_CLOSE(fd);
        }

        // We must reset these guys regardless; calling close again after a
        // failed close causes crashes on some systems.
        fh = nullptr;
        fd = -1;
        closed = (ret == 0);
    }

    // Report errors.
    if (!flushed || !closed) {
        if (flushed) {
            // If not flushed, we want the flush error to fall through.
            q->setError(QFile::UnspecifiedError, QSystemError::stdString(errno));
        }
        return false;
    }

    return true;
}